

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O3

void __thiscall
QArrayDataPointer<QAccessible::ActivationObserver_*>::relocate
          (QArrayDataPointer<QAccessible::ActivationObserver_*> *this,qsizetype offset,
          ActivationObserver ***data)

{
  ActivationObserver **d_first;
  ActivationObserver **ppAVar1;
  
  d_first = this->ptr + offset;
  QtPrivate::q_relocate_overlap_n<QAccessible::ActivationObserver*,long_long>
            (this->ptr,this->size,d_first);
  if (data != (ActivationObserver ***)0x0) {
    ppAVar1 = *data;
    if ((this->ptr <= ppAVar1) && (ppAVar1 < this->ptr + this->size)) {
      *data = ppAVar1 + offset;
    }
  }
  this->ptr = d_first;
  return;
}

Assistant:

void relocate(qsizetype offset, const T **data = nullptr)
    {
        T *res = this->ptr + offset;
        QtPrivate::q_relocate_overlap_n(this->ptr, this->size, res);
        // first update data pointer, then this->ptr
        if (data && QtPrivate::q_points_into_range(*data, *this))
            *data += offset;
        this->ptr = res;
    }